

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

wchar_t archive_write_mtree_close(archive_write *a)

{
  att_counter_set *top;
  attr_counter **top_00;
  attr_counter **top_01;
  attr_counter **top_02;
  mtree_writer *mtree;
  wchar_t wVar1;
  wchar_t wVar2;
  mtree_entry_conflict *pmVar3;
  attr_counter *paVar4;
  uint uVar5;
  attr_counter *paVar6;
  mtree_entry_conflict *pmVar7;
  dir_info *pdVar8;
  mtree_entry_conflict *e;
  mtree_entry_conflict *local_48;
  att_counter_set *acs;
  
  mtree = (mtree_writer *)a->format_data;
  local_48 = mtree->root;
  if (local_48 != (mtree_entry_conflict *)0x0) {
    top = &mtree->acs;
    top_00 = &(mtree->acs).gid_list;
    top_01 = &(mtree->acs).mode_list;
    top_02 = &(mtree->acs).flags_list;
    do {
      if (mtree->output_global_set != L'\0') {
        attr_counter_set_free(mtree);
        pdVar8 = local_48->dir_info;
        pmVar3 = (mtree_entry_conflict *)0x0;
        uVar5 = 0;
        while (pmVar3 = (mtree_entry_conflict *)
                        __archive_rb_tree_iterate(&pdVar8->rbtree,&pmVar3->rbnode,uVar5),
              pmVar3 != (mtree_entry_conflict *)0x0) {
          wVar2 = mtree->keys;
          if ((wVar2 & 0x300000U) != 0) {
            if (top->uid_list == (attr_counter *)0x0) {
              paVar4 = attr_counter_new(pmVar3,(attr_counter *)0x0);
              top->uid_list = paVar4;
              if (paVar4 == (attr_counter *)0x0) goto LAB_0016a6bf;
            }
            else {
              paVar4 = (attr_counter *)0x0;
              paVar6 = top->uid_list;
              while ((paVar6 != (attr_counter *)0x0 && (paVar6->m_entry->uid != pmVar3->uid))) {
                paVar4 = paVar6;
                paVar6 = paVar6->next;
              }
              wVar1 = attr_counter_inc(&top->uid_list,paVar6,paVar4,pmVar3);
              if (wVar1 < L'\0') goto LAB_0016a6bf;
            }
          }
          if ((wVar2 & 0x30U) != 0) {
            if (*top_00 == (attr_counter *)0x0) {
              paVar4 = attr_counter_new(pmVar3,(attr_counter *)0x0);
              *top_00 = paVar4;
              if (paVar4 == (attr_counter *)0x0) goto LAB_0016a6bf;
            }
            else {
              paVar4 = (attr_counter *)0x0;
              paVar6 = *top_00;
              while ((paVar6 != (attr_counter *)0x0 && (paVar6->m_entry->gid != pmVar3->gid))) {
                paVar4 = paVar6;
                paVar6 = paVar6->next;
              }
              wVar1 = attr_counter_inc(top_00,paVar6,paVar4,pmVar3);
              if (wVar1 < L'\0') goto LAB_0016a6bf;
            }
          }
          if (((uint)wVar2 >> 9 & 1) != 0) {
            if (*top_01 == (attr_counter *)0x0) {
              paVar4 = attr_counter_new(pmVar3,(attr_counter *)0x0);
              *top_01 = paVar4;
              if (paVar4 == (attr_counter *)0x0) goto LAB_0016a6bf;
            }
            else {
              paVar4 = (attr_counter *)0x0;
              paVar6 = *top_01;
              while ((paVar6 != (attr_counter *)0x0 && (paVar6->m_entry->mode != pmVar3->mode))) {
                paVar4 = paVar6;
                paVar6 = paVar6->next;
              }
              wVar1 = attr_counter_inc(top_01,paVar6,paVar4,pmVar3);
              if (wVar1 < L'\0') goto LAB_0016a6bf;
            }
          }
          if ((wVar2 & 8U) != 0) {
            if (*top_02 == (attr_counter *)0x0) {
              paVar4 = attr_counter_new(pmVar3,(attr_counter *)0x0);
              *top_02 = paVar4;
              if (paVar4 == (attr_counter *)0x0) goto LAB_0016a6bf;
            }
            else {
              paVar4 = (attr_counter *)0x0;
              paVar6 = *top_02;
              while ((paVar6 != (attr_counter *)0x0 &&
                     ((paVar6->m_entry->fflags_set != pmVar3->fflags_set ||
                      (paVar6->m_entry->fflags_clear != pmVar3->fflags_clear))))) {
                paVar4 = paVar6;
                paVar6 = paVar6->next;
              }
              wVar2 = attr_counter_inc(top_02,paVar6,paVar4,pmVar3);
              if (wVar2 < L'\0') {
LAB_0016a6bf:
                archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
                return L'\xffffffe2';
              }
            }
          }
          pdVar8 = local_48->dir_info;
          uVar5 = 1;
        }
      }
      if ((local_48->dir_info->virtual == L'\0') || (mtree->classic != L'\0')) {
        wVar2 = write_mtree_entry(a,local_48);
        if (wVar2 != L'\0') {
          return L'\xffffffe2';
        }
      }
      else if (mtree->output_global_set != L'\0') {
        write_global(mtree);
      }
      mtree->depth = mtree->depth + L'\x01';
      pdVar8 = local_48->dir_info;
      pmVar3 = (mtree_entry_conflict *)0x0;
      uVar5 = 0;
      while (pmVar3 = (mtree_entry_conflict *)
                      __archive_rb_tree_iterate(&pdVar8->rbtree,&pmVar3->rbnode,uVar5),
            pmVar3 != (mtree_entry_conflict *)0x0) {
        if (pmVar3->dir_info == (dir_info *)0x0) {
          wVar2 = write_mtree_entry(a,pmVar3);
          if (wVar2 != L'\0') {
            return L'\xffffffe2';
          }
          pdVar8 = local_48->dir_info;
        }
        else {
          pmVar3->dir_info->chnext = (mtree_entry_conflict *)0x0;
          *(local_48->dir_info->children).last = pmVar3;
          pdVar8 = local_48->dir_info;
          (pdVar8->children).last = &pmVar3->dir_info->chnext;
        }
        uVar5 = 1;
      }
      wVar2 = mtree->depth;
      mtree->depth = wVar2 + L'\xffffffff';
      pmVar3 = (local_48->dir_info->children).first;
      if (pmVar3 == (mtree_entry_conflict *)0x0) {
        if ((mtree->classic != L'\0') && (wVar2 = write_dot_dot_entry(a,local_48), wVar2 != L'\0'))
        {
          return L'\xffffffe2';
        }
        while ((pmVar7 = local_48, pmVar3 = pmVar7->parent, local_48 = pmVar7, pmVar7 != pmVar3 &&
               (local_48 = pmVar7->dir_info->chnext, local_48 == (mtree_entry_conflict *)0x0))) {
          if (mtree->indent != L'\0') {
            mtree->depth = mtree->depth + L'\xffffffff';
          }
          local_48 = pmVar3;
          if (mtree->classic != L'\0') {
            wVar2 = write_dot_dot_entry(a,pmVar3);
            if (wVar2 != L'\0') {
              return L'\xffffffe2';
            }
            local_48 = pmVar7->parent;
          }
        }
      }
      else {
        local_48 = pmVar3;
        if (mtree->indent != L'\0') {
          mtree->depth = wVar2;
        }
      }
    } while (local_48 != local_48->parent);
  }
  archive_write_set_bytes_in_last_block(&a->archive,1);
  wVar2 = __archive_write_output(a,(mtree->buf).s,(mtree->buf).length);
  return wVar2;
}

Assistant:

static int
archive_write_mtree_close(struct archive_write *a)
{
	struct mtree_writer *mtree= a->format_data;
	int ret;

	if (mtree->root != NULL) {
		ret = write_mtree_entry_tree(a);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	archive_write_set_bytes_in_last_block(&a->archive, 1);

	return __archive_write_output(a, mtree->buf.s, mtree->buf.length);
}